

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavProcessItem(ImGuiWindow *window,ImRect *nav_bb,ImGuiID id)

{
  bool bVar1;
  ImVec2 *pIVar2;
  ImGuiNavMoveResult *pIVar3;
  float fVar4;
  float fVar5;
  bool local_a1;
  ImGui *local_a0;
  float VISIBLE_RATIO;
  bool new_best;
  ImGuiNavMoveResult *result;
  undefined1 local_44 [8];
  undefined1 local_3c [8];
  ImRect nav_bb_rel;
  ImGuiItemFlags item_flags;
  ImGuiContext *g;
  ImGuiID id_local;
  ImRect *nav_bb_local;
  ImGuiWindow *window_local;
  
  stack0xffffffffffffffd8 = (ImVec2)GImGui;
  nav_bb_rel.Max.x = (float)(window->DC).ItemFlags;
  local_44 = (undefined1  [8])::operator-(&nav_bb->Min,&window->Pos);
  unique0x100000c1 = ::operator-(&nav_bb->Max,&window->Pos);
  pIVar3 = (ImGuiNavMoveResult *)local_44;
  ImRect::ImRect((ImRect *)local_3c,(ImVec2 *)pIVar3,(ImVec2 *)((long)&result + 4));
  if (((*(bool *)((long)stack0xffffffffffffffd8 + 0x1bdd) & 1U) != 0) &&
     (*(ImGuiNavLayer *)((long)stack0xffffffffffffffd8 + 0x1bd0) == (window->DC).NavLayerCurrent)) {
    if ((((uint)nav_bb_rel.Max.x & 0x10) == 0) ||
       (*(ImGuiID *)((long)stack0xffffffffffffffd8 + 0x1be0) == 0)) {
      *(ImGuiID *)((long)stack0xffffffffffffffd8 + 0x1be0) = id;
      ((ImVec2 *)((long)stack0xffffffffffffffd8 + 0x1be4))->x = (float)local_3c._0_4_;
      ((ImVec2 *)((long)stack0xffffffffffffffd8 + 0x1be4))->y = (float)local_3c._4_4_;
      *(ImVec2 *)((long)stack0xffffffffffffffd8 + 0x1bec) = nav_bb_rel.Min;
    }
    if (((uint)nav_bb_rel.Max.x & 0x10) == 0) {
      *(bool *)((long)stack0xffffffffffffffd8 + 0x1bdd) = false;
      NavUpdateAnyRequestFlag();
    }
  }
  if (((*(ImGuiID *)((long)stack0xffffffffffffffd8 + 0x1b90) != id) ||
      ((*(ImGuiNavMoveFlags *)((long)stack0xffffffffffffffd8 + 0x1bf8) & 0x10U) != 0)) &&
     (((uint)nav_bb_rel.Max.x & 0xc) == 0)) {
    if (window == *(ImGuiWindow **)((long)stack0xffffffffffffffd8 + 0x1b88)) {
      local_a0 = (ImGui *)((long)stack0xffffffffffffffd8 + 0x1c10);
    }
    else {
      local_a0 = (ImGui *)((long)stack0xffffffffffffffd8 + 0x1c70);
    }
    local_a1 = false;
    if ((*(bool *)((long)stack0xffffffffffffffd8 + 0x1bf5) & 1U) != 0) {
      local_a1 = NavScoreItem(local_a0,pIVar3,*nav_bb);
    }
    if (local_a1 != false) {
      *(ImGuiWindow **)local_a0 = window;
      *(ImGuiID *)(local_a0 + 8) = id;
      *(ImGuiID *)(local_a0 + 0xc) = (window->DC).NavFocusScopeIdCurrent;
      *(undefined4 *)(local_a0 + 0x1c) = local_3c._0_4_;
      *(undefined4 *)(local_a0 + 0x20) = local_3c._4_4_;
      *(ImVec2 *)(local_a0 + 0x24) = nav_bb_rel.Min;
    }
    if (((*(ImGuiNavMoveFlags *)((long)stack0xffffffffffffffd8 + 0x1bf8) & 0x20U) != 0) &&
       (pIVar3 = (ImGuiNavMoveResult *)nav_bb, bVar1 = ImRect::Overlaps(&window->ClipRect,nav_bb),
       bVar1)) {
      fVar4 = ImClamp<float>((nav_bb->Max).y,(window->ClipRect).Min.y,(window->ClipRect).Max.y);
      fVar5 = ImClamp<float>((nav_bb->Min).y,(window->ClipRect).Min.y,(window->ClipRect).Max.y);
      if ((((nav_bb->Max).y - (nav_bb->Min).y) * 0.7 <= fVar4 - fVar5) &&
         (bVar1 = NavScoreItem((ImGui *)((long)stack0xffffffffffffffd8 + 0x1c40),pIVar3,*nav_bb),
         bVar1)) {
        ((ImGuiNavMoveResult *)((long)stack0xffffffffffffffd8 + 0x1c40))->Window = window;
        *(ImGuiID *)((long)stack0xffffffffffffffd8 + 0x1c48) = id;
        *(ImGuiID *)((long)stack0xffffffffffffffd8 + 0x1c4c) = (window->DC).NavFocusScopeIdCurrent;
        ((ImVec2 *)((long)stack0xffffffffffffffd8 + 0x1c5c))->x = (float)local_3c._0_4_;
        ((ImVec2 *)((long)stack0xffffffffffffffd8 + 0x1c5c))->y = (float)local_3c._4_4_;
        *(ImVec2 *)((long)stack0xffffffffffffffd8 + 0x1c64) = nav_bb_rel.Min;
      }
    }
  }
  if (*(ImGuiID *)((long)stack0xffffffffffffffd8 + 0x1b90) == id) {
    *(ImGuiWindow **)((long)stack0xffffffffffffffd8 + 0x1b88) = window;
    *(ImGuiNavLayer *)((long)stack0xffffffffffffffd8 + 0x1bd0) = (window->DC).NavLayerCurrent;
    *(ImGuiID *)((long)stack0xffffffffffffffd8 + 0x1b94) = (window->DC).NavFocusScopeIdCurrent;
    *(bool *)((long)stack0xffffffffffffffd8 + 0x1bd8) = true;
    *(int *)((long)stack0xffffffffffffffd8 + 0x1bd4) = (window->DC).FocusCounterTabStop;
    pIVar2 = &window->NavRectRel[(window->DC).NavLayerCurrent].Min;
    pIVar2->x = (float)local_3c._0_4_;
    pIVar2->y = (float)local_3c._4_4_;
    pIVar2[1] = nav_bb_rel.Min;
  }
  return;
}

Assistant:

static void ImGui::NavProcessItem(ImGuiWindow* window, const ImRect& nav_bb, const ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    //if (!g.IO.NavActive)  // [2017/10/06] Removed this possibly redundant test but I am not sure of all the side-effects yet. Some of the feature here will need to work regardless of using a _NoNavInputs flag.
    //    return;

    const ImGuiItemFlags item_flags = window->DC.ItemFlags;
    const ImRect nav_bb_rel(nav_bb.Min - window->Pos, nav_bb.Max - window->Pos);

    // Process Init Request
    if (g.NavInitRequest && g.NavLayer == window->DC.NavLayerCurrent)
    {
        // Even if 'ImGuiItemFlags_NoNavDefaultFocus' is on (typically collapse/close button) we record the first ResultId so they can be used as a fallback
        if (!(item_flags & ImGuiItemFlags_NoNavDefaultFocus) || g.NavInitResultId == 0)
        {
            g.NavInitResultId = id;
            g.NavInitResultRectRel = nav_bb_rel;
        }
        if (!(item_flags & ImGuiItemFlags_NoNavDefaultFocus))
        {
            g.NavInitRequest = false; // Found a match, clear request
            NavUpdateAnyRequestFlag();
        }
    }

    // Process Move Request (scoring for navigation)
    // FIXME-NAV: Consider policy for double scoring (scoring from NavScoringRectScreen + scoring from a rect wrapped according to current wrapping policy)
    if ((g.NavId != id || (g.NavMoveRequestFlags & ImGuiNavMoveFlags_AllowCurrentNavId)) && !(item_flags & (ImGuiItemFlags_Disabled|ImGuiItemFlags_NoNav)))
    {
        ImGuiNavMoveResult* result = (window == g.NavWindow) ? &g.NavMoveResultLocal : &g.NavMoveResultOther;
#if IMGUI_DEBUG_NAV_SCORING
        // [DEBUG] Score all items in NavWindow at all times
        if (!g.NavMoveRequest)
            g.NavMoveDir = g.NavMoveDirLast;
        bool new_best = NavScoreItem(result, nav_bb) && g.NavMoveRequest;
#else
        bool new_best = g.NavMoveRequest && NavScoreItem(result, nav_bb);
#endif
        if (new_best)
        {
            result->Window = window;
            result->ID = id;
            result->FocusScopeId = window->DC.NavFocusScopeIdCurrent;
            result->RectRel = nav_bb_rel;
        }

        // Features like PageUp/PageDown need to maintain a separate score for the visible set of items.
        const float VISIBLE_RATIO = 0.70f;
        if ((g.NavMoveRequestFlags & ImGuiNavMoveFlags_AlsoScoreVisibleSet) && window->ClipRect.Overlaps(nav_bb))
            if (ImClamp(nav_bb.Max.y, window->ClipRect.Min.y, window->ClipRect.Max.y) - ImClamp(nav_bb.Min.y, window->ClipRect.Min.y, window->ClipRect.Max.y) >= (nav_bb.Max.y - nav_bb.Min.y) * VISIBLE_RATIO)
                if (NavScoreItem(&g.NavMoveResultLocalVisibleSet, nav_bb))
                {
                    result = &g.NavMoveResultLocalVisibleSet;
                    result->Window = window;
                    result->ID = id;
                    result->FocusScopeId = window->DC.NavFocusScopeIdCurrent;
                    result->RectRel = nav_bb_rel;
                }
    }

    // Update window-relative bounding box of navigated item
    if (g.NavId == id)
    {
        g.NavWindow = window;                                           // Always refresh g.NavWindow, because some operations such as FocusItem() don't have a window.
        g.NavLayer = window->DC.NavLayerCurrent;
        g.NavFocusScopeId = window->DC.NavFocusScopeIdCurrent;
        g.NavIdIsAlive = true;
        g.NavIdTabCounter = window->DC.FocusCounterTabStop;
        window->NavRectRel[window->DC.NavLayerCurrent] = nav_bb_rel;    // Store item bounding box (relative to window position)
    }
}